

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::Message(string *m,cmMessageMetadata *md)

{
  bool bVar1;
  ostream *this;
  cmMessageMetadata *md_local;
  string *m_local;
  
  bVar1 = std::function::operator_cast_to_bool
                    ((function *)(anonymous_namespace)::s_MessageCallback_abi_cxx11_);
  if (bVar1) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cmMessageMetadata_&)>
    ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cmMessageMetadata_&)>
                  *)(anonymous_namespace)::s_MessageCallback_abi_cxx11_,m,md);
  }
  else {
    this = std::operator<<((ostream *)&std::cerr,(string *)m);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void cmSystemTools::Message(const std::string& m, const cmMessageMetadata& md)
{
  if (s_MessageCallback) {
    s_MessageCallback(m, md);
  } else {
    std::cerr << m << std::endl;
  }
}